

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O0

void __thiscall UnitTest_semantic13::Run(UnitTest_semantic13 *this)

{
  bool bVar1;
  byte bVar2;
  SemanticException *anon_var_0_2;
  SemanticException *anon_var_0_1;
  SemanticException *anon_var_0;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffe30;
  allocator *this_00;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  UnitTestBase *this_01;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [55];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [55];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [47];
  allocator local_69;
  string local_68 [55];
  undefined1 local_31 [49];
  
  this_01 = (UnitTestBase *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"a = -#{1, 2, 3} + 1",(allocator *)this_01);
  anon_unknown.dwarf_fc1b::Semantic
            ((string *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a9c7d);
  bVar2 = bVar1 ^ 0xff;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffe30);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"\'Semantic(\"a = -#{1, 2, 3} + 1\")\'",&local_69);
    UnitTestBase::Error(this_01,(string *)CONCAT17(bVar2,in_stack_fffffffffffffe58));
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"a = (1 > 2) + 1",&local_99);
  anon_unknown.dwarf_fc1b::Semantic((string *)CONCAT17(bVar2,in_stack_fffffffffffffe58));
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffe30);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,"\'{ Semantic(\"a = (1 > 2) + 1\"); }\' has no luna::SemanticException",
             &local_c1);
  UnitTestBase::Error(this_01,(string *)CONCAT17(bVar2,in_stack_fffffffffffffe58));
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"a = (1 ~= 2) > 1",&local_f9);
  anon_unknown.dwarf_fc1b::Semantic((string *)CONCAT17(bVar2,in_stack_fffffffffffffe58));
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffe30);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  this_00 = &local_121;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_120,"\'{ Semantic(\"a = (1 ~= 2) > 1\"); }\' has no luna::SemanticException",
             this_00);
  UnitTestBase::Error(this_01,(string *)CONCAT17(bVar2,in_stack_fffffffffffffe58));
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"a = not a >= true",&local_159);
  anon_unknown.dwarf_fc1b::Semantic((string *)CONCAT17(bVar2,in_stack_fffffffffffffe58));
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)this_00);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,"\'{ Semantic(\"a = not a >= true\"); }\' has no luna::SemanticException",
             &local_181);
  UnitTestBase::Error(this_01,(string *)CONCAT17(bVar2,in_stack_fffffffffffffe58));
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  return;
}

Assistant:

TEST_CASE(semantic13)
{
    EXPECT_TRUE(Semantic("a = -#{1, 2, 3} + 1"));
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = (1 > 2) + 1");
    });
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = (1 ~= 2) > 1");
    });
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = not a >= true");
    });
}